

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

string * libcellml::resolvePath(string *__return_storage_ptr__,string *filename,string *base)

{
  string sStack_38;
  
  pathFromUrl(&sStack_38,base);
  std::operator+(__return_storage_ptr__,&sStack_38,filename);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string resolvePath(const std::string &filename, const std::string &base)
{
    return pathFromUrl(base) + filename;
}